

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O0

void Bmcg_ManPrintFrame(Bmcg_Man_t *p,int f,int nClauses,int Solver,abctime clkStart)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  double dVar4;
  double dVar5;
  int fUnfinished;
  abctime clkStart_local;
  int Solver_local;
  int nClauses_local;
  int f_local;
  Bmcg_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    Abc_Print(1,"%4d %s : ",(ulong)(uint)f,"+");
    iVar1 = bmcg_sat_solver_varnum(p->pSats[0]);
    iVar2 = bmcg_sat_solver_elim_varnum(p->pSats[0]);
    Abc_Print(1,"Var =%8.0f.  ",(double)(iVar1 - iVar2));
    iVar1 = bmcg_sat_solver_clausenum(p->pSats[0]);
    Abc_Print(1,"Cla =%9.0f.  ",(double)iVar1);
    iVar1 = bmcg_sat_solver_learntnum(p->pSats[0]);
    Abc_Print(1,"Learn =%9.0f.  ",(double)iVar1);
    iVar1 = bmcg_sat_solver_conflictnum(p->pSats[0]);
    Abc_Print(1,"Conf =%9.0f.  ",(double)iVar1);
    if (1 < p->pPars->nProcs) {
      Abc_Print(1,"S = %3d. ",(ulong)(uint)Solver);
    }
    dVar4 = Gia_ManMemory(p->pFrames);
    dVar5 = Vec_IntMemory(&p->vFr2Sat);
    Abc_Print(1,"%4.0f MB",(((double)(int)dVar4 + dVar5) * 1.0) / 1048576.0);
    aVar3 = Abc_Clock();
    Abc_Print(1,"%9.2f sec  ",(double)((float)(aVar3 - clkStart) / 1e+06));
    printf("\n");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Bmcg_ManPrintFrame( Bmcg_Man_t * p, int f, int nClauses, int Solver, abctime clkStart )
{
    int fUnfinished = 0;
    if ( !p->pPars->fVerbose )
        return;
    Abc_Print( 1, "%4d %s : ", f,   fUnfinished ? "-" : "+" );
//    Abc_Print( 1, "Var =%8.0f.  ",  (double)p->nSatVars ); 
//    Abc_Print( 1, "Cla =%9.0f.  ",  (double)nClauses );  
    Abc_Print( 1, "Var =%8.0f.  ",  (double)(bmcg_sat_solver_varnum(p->pSats[0])-bmcg_sat_solver_elim_varnum(p->pSats[0])) ); 
    Abc_Print( 1, "Cla =%9.0f.  ",  (double)bmcg_sat_solver_clausenum(p->pSats[0]) );  
    Abc_Print( 1, "Learn =%9.0f.  ",(double)bmcg_sat_solver_learntnum(p->pSats[0]) );  
    Abc_Print( 1, "Conf =%9.0f.  ", (double)bmcg_sat_solver_conflictnum(p->pSats[0]) );  
    if ( p->pPars->nProcs > 1 )
        Abc_Print( 1, "S = %3d. ",  Solver );
    Abc_Print( 1, "%4.0f MB",       1.0*((int)Gia_ManMemory(p->pFrames) + Vec_IntMemory(&p->vFr2Sat))/(1<<20) );
    Abc_Print( 1, "%9.2f sec  ",    (float)(Abc_Clock() - clkStart)/(float)(CLOCKS_PER_SEC) );
    printf( "\n" );
    fflush( stdout );
}